

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::parsePluginData(Moc *this,ClassDef *def)

{
  IncludePath *pIVar1;
  long lVar2;
  Data *pDVar3;
  bool bVar4;
  char cVar5;
  char *pcVar6;
  reference ba;
  long lVar7;
  Data *pDVar8;
  QByteArray *__return_storage_ptr__;
  IncludePath *p;
  IncludePath *pIVar9;
  QStringBuilder<const_char_(&)[22],_QByteArray> *__return_storage_ptr___00;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  char *local_1f8;
  Data *local_1f0;
  Data *local_1e8;
  QString local_1c0;
  QByteArray local_1a8;
  QByteArray local_190;
  QStringBuilder<const_char_(&)[22],_QByteArray> local_178;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]> local_150;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
  local_128;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [40];
  QByteArrayView local_b0;
  QFileInfo fi;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(&this->super_Parser,LPAREN);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.size = 0;
  local_1e8 = (Data *)0x0;
  local_1f0 = (Data *)0x0;
  local_1f8 = (char *)0x0;
  while( true ) {
    bVar4 = Parser::test(&this->super_Parser,IDENTIFIER);
    if (!bVar4) break;
    local_78.size = -0x5555555555555556;
    local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_78.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    Parser::lexem((QByteArray *)&local_78,&this->super_Parser);
    local_128.a.a.a = (char (*) [22])0x136ac6;
    bVar4 = operator==((QByteArray *)&local_78,(char **)&local_128);
    if (bVar4) {
      Parser::next(&this->super_Parser,PP_STRING_LITERAL);
      Parser::unquotedLexem((QByteArray *)&local_128,&this->super_Parser);
      pDVar8 = (def->pluginData).iid.d.d;
      pDVar3 = (Data *)(def->pluginData).iid.d.ptr;
      (def->pluginData).iid.d.d = (Data *)local_128.a.a.a;
      (def->pluginData).iid.d.ptr = (char *)local_128.a.a.b.d.d;
      pcVar6 = (char *)(def->pluginData).iid.d.size;
      (def->pluginData).iid.d.size = (qsizetype)local_128.a.a.b.d.ptr;
      local_128.a.a.a = (char (*) [22])pDVar8;
      local_128.a.a.b.d.d = pDVar3;
LAB_00117729:
      local_128.a.a.b.d.ptr = pcVar6;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
    }
    else {
      local_128.a.a.a = (char (*) [22])0x136aca;
      bVar4 = operator==((QByteArray *)&local_78,(char **)&local_128);
      if (bVar4) {
        Parser::next(&this->super_Parser,PP_STRING_LITERAL);
        Parser::unquotedLexem((QByteArray *)&local_128,&this->super_Parser);
        pDVar8 = (def->pluginData).uri.d.d;
        pDVar3 = (Data *)(def->pluginData).uri.d.ptr;
        (def->pluginData).uri.d.d = (Data *)local_128.a.a.a;
        (def->pluginData).uri.d.ptr = (char *)local_128.a.a.b.d.d;
        pcVar6 = (char *)(def->pluginData).uri.d.size;
        (def->pluginData).uri.d.size = (qsizetype)local_128.a.a.b.d.ptr;
        local_128.a.a.a = (char (*) [22])pDVar8;
        local_128.a.a.b.d.d = pDVar3;
        goto LAB_00117729;
      }
      local_128.a.a.a = (char (*) [22])0x136ace;
      bVar4 = operator==((QByteArray *)&local_78,(char **)&local_128);
      if (bVar4) {
        Parser::next(&this->super_Parser,PP_STRING_LITERAL);
        local_98.size = -0x5555555555555556;
        local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_98.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        Parser::unquotedLexem((QByteArray *)&local_98,&this->super_Parser);
        _fi = (Data *)0xaaaaaaaaaaaaaaaa;
        ba = std::stack<QByteArray,_QList<QByteArray>_>::top(&(this->super_Parser).currentFilenames)
        ;
        QString::fromLocal8Bit<void>((QString *)&local_128,ba);
        QFileInfo::QFileInfo((QFileInfo *)local_d8,(QString *)&local_128);
        QFileInfo::dir();
        QString::fromLocal8Bit<void>((QString *)&local_150,(QByteArray *)&local_98);
        QFileInfo::QFileInfo(&fi,(QDir *)&local_178,(QString *)&local_150);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_150);
        QDir::~QDir((QDir *)&local_178);
        QFileInfo::~QFileInfo((QFileInfo *)local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
        pIVar1 = (this->super_Parser).includes.d.ptr;
        lVar2 = (this->super_Parser).includes.d.size;
        pIVar9 = pIVar1;
        for (lVar7 = 0; lVar2 << 5 != lVar7; lVar7 = lVar7 + 0x20) {
          cVar5 = QFileInfo::exists();
          if (cVar5 != '\0') break;
          if (pIVar9[0x18] == (IncludePath)0x0) {
            local_d8._0_8_ = *(undefined8 *)(pIVar1 + lVar7 + 8);
            if ((Data *)local_d8._0_8_ == (Data *)0x0) {
              local_d8._0_8_ = &QByteArray::_empty;
            }
            QByteArrayView::QByteArrayView<const_char_*,_true>(&local_b0,(char **)local_d8);
            QVar10.m_data = (storage_type *)local_b0.m_size;
            QVar10.m_size = (qsizetype)&local_128;
            QString::fromLocal8Bit(QVar10);
            QDir::QDir((QDir *)&local_178,(QString *)&local_128);
            local_190.d.d = (Data *)local_98.ptr;
            if ((Data *)local_98.ptr == (Data *)0x0) {
              local_190.d.d = (Data *)&QByteArray::_empty;
            }
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)(local_d8 + 0x18),(char **)&local_190);
            QVar11.m_data = (storage_type *)local_d8._24_8_;
            QVar11.m_size = (qsizetype)&local_150;
            QString::fromLocal8Bit(QVar11);
            QFileInfo::setFile((QDir *)&fi,(QString *)&local_178);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_150);
            QDir::~QDir((QDir *)&local_178);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_128);
            cVar5 = QFileInfo::isDir();
            if (cVar5 != '\0') {
              QFileInfo::QFileInfo((QFileInfo *)&local_128);
              pDVar8 = _fi;
              _fi = (Data *)local_128.a.a.a;
              local_128.a.a.a = (char (*) [22])pDVar8;
              QFileInfo::~QFileInfo((QFileInfo *)&local_128);
            }
          }
          pIVar9 = pIVar9 + 0x20;
        }
        cVar5 = QFileInfo::exists();
        if (cVar5 == '\0') {
          __return_storage_ptr___00 = &local_178;
          local_178.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          local_178.a = (char (*) [22])0xaaaaaaaaaaaaaaaa;
          local_178.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          __return_storage_ptr__ = (QByteArray *)local_d8;
          Parser::lexem(__return_storage_ptr__,&this->super_Parser);
          operator+(&local_150.a,(char (*) [22])"Plugin Metadata file ",__return_storage_ptr__);
          operator+((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>
                     *)&local_128,&local_150.a,
                    (char (*) [45])" does not exist. Declaration will be ignored");
          QStringBuilder::operator_cast_to_QByteArray
                    ((ConvertTo *)__return_storage_ptr___00,(QStringBuilder *)&local_128);
          QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>::
          ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>
                           *)&local_128);
          QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder(&local_150.a);
LAB_00117de3:
          QByteArray::~QByteArray(__return_storage_ptr__);
          pDVar8 = (__return_storage_ptr___00->b).d.d;
          if (pDVar8 == (Data *)0x0) {
            pDVar8 = (Data *)&QByteArray::_empty;
          }
          Parser::error(&this->super_Parser,(char *)pDVar8);
        }
        local_e8 = 0xaaaaaaaaaaaaaaaa;
        uStack_e0 = 0xaaaaaaaaaaaaaaaa;
        QFileInfo::canonicalFilePath();
        QFile::QFile((QFile *)&local_e8,(QString *)&local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
        cVar5 = QFile::open((QFile *)&local_e8,1);
        if (cVar5 == '\0') {
          __return_storage_ptr___00 = (QStringBuilder<const_char_(&)[22],_QByteArray> *)local_d8;
          local_d8._16_8_ = (char *)0xaaaaaaaaaaaaaaaa;
          local_d8._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
          local_d8._8_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
          Parser::lexem(&local_190,&this->super_Parser);
          operator+(&local_178,(char (*) [22])"Plugin Metadata file ",&local_190);
          operator+(&local_150,&local_178,(char (*) [23])" could not be opened: ");
          QIODevice::errorString();
          QString::toUtf8(&local_1a8,&local_1c0);
          operator+(&local_128,&local_150,&local_1a8);
          QStringBuilder::operator_cast_to_QByteArray
                    ((ConvertTo *)__return_storage_ptr___00,(QStringBuilder *)&local_128);
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>,_QByteArray>
          ::~QStringBuilder(&local_128);
          QByteArray::~QByteArray(&local_1a8);
          QString::~QString(&local_1c0);
          QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[23]>::
          ~QStringBuilder(&local_150);
          QStringBuilder<const_char_(&)[22],_QByteArray>::~QStringBuilder(&local_178);
          __return_storage_ptr__ = &local_190;
          goto LAB_00117de3;
        }
        QFileInfo::canonicalFilePath();
        QList<QString>::emplaceBack<QString>(&this->parsedPluginMetadataFiles,(QString *)&local_128)
        ;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
        QIODevice::readAll();
        pDVar8 = (Data *)local_128.a.a.a;
        pDVar3 = local_128.a.a.b.d.d;
        local_58.d = (Data *)local_128.a.a.a;
        local_128.a.a.a = (char (*) [22])local_1f0;
        local_58.ptr = (char *)local_128.a.a.b.d.d;
        local_128.a.a.b.d.d = local_1e8;
        pcVar6 = local_128.a.a.b.d.ptr;
        local_58.size = (qsizetype)local_128.a.a.b.d.ptr;
        local_128.a.a.b.d.ptr = local_1f8;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
        QFile::~QFile((QFile *)&local_e8);
        QFileInfo::~QFileInfo(&fi);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
        local_1f8 = pcVar6;
        local_1f0 = pDVar8;
        local_1e8 = pDVar3;
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  }
  if (local_1f8 != (char *)0x0) {
    QJsonDocument::fromJson((QByteArray *)&local_128,(QJsonParseError *)&local_58);
    QJsonDocument::swap(&(def->pluginData).metaData);
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_128);
    cVar5 = QJsonDocument::isObject();
    if (cVar5 == '\0') {
      local_178.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_178.a = (char (*) [22])0xaaaaaaaaaaaaaaaa;
      local_178.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      Parser::lexem((QByteArray *)&local_78,&this->super_Parser);
      local_150.a.b.d.size = local_78.size;
      local_150.a.b.d.ptr = local_78.ptr;
      local_150.a.b.d.d = local_78.d;
      local_150.a.a = (char (*) [22])0x136ad3;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char *)0x0;
      local_78.size = 0;
      QStringBuilder<const_char_(&)[22],_QByteArray>::QStringBuilder
                ((QStringBuilder<const_char_(&)[22],_QByteArray> *)&local_128,&local_150.a);
      local_128.a.b = (char (*) [23])0x136b2d;
      QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>::
      convertTo<QByteArray>
                ((QByteArray *)&local_178,
                 (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[67]>
                  *)&local_128);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_128.a.a.b.d);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_150.a.b.d);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
      pDVar8 = local_178.b.d.d;
      if (local_178.b.d.d == (Data *)0x0) {
        pDVar8 = (Data *)&QByteArray::_empty;
      }
      Parser::warning(&this->super_Parser,(char *)pDVar8);
      local_128.a.a.a = (char (*) [22])(def->pluginData).iid.d.d;
      local_128.a.a.b.d.d = (Data *)(def->pluginData).iid.d.ptr;
      (def->pluginData).iid.d.d = (Data *)0x0;
      (def->pluginData).iid.d.ptr = (char *)0x0;
      local_128.a.a.b.d.ptr = (char *)(def->pluginData).iid.d.size;
      (def->pluginData).iid.d.size = 0;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      local_128.a.a.a = (char (*) [22])(def->pluginData).uri.d.d;
      local_128.a.a.b.d.d = (Data *)(def->pluginData).uri.d.ptr;
      (def->pluginData).uri.d.d = (Data *)0x0;
      (def->pluginData).uri.d.ptr = (char *)0x0;
      local_128.a.a.b.d.ptr = (char *)(def->pluginData).uri.d.size;
      (def->pluginData).uri.d.size = 0;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_178);
      goto LAB_00117c52;
    }
  }
  this->mustIncludeQPluginH = true;
  Parser::next(&this->super_Parser,PP_RPAREN);
LAB_00117c52:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::parsePluginData(ClassDef *def)
{
    next(LPAREN);
    QByteArray metaData;
    while (test(IDENTIFIER)) {
        QByteArray l = lexem();
        if (l == "IID") {
            next(STRING_LITERAL);
            def->pluginData.iid = unquotedLexem();
        } else if (l == "URI") {
            next(STRING_LITERAL);
            def->pluginData.uri = unquotedLexem();
        } else if (l == "FILE") {
            next(STRING_LITERAL);
            QByteArray metaDataFile = unquotedLexem();
            QFileInfo fi(QFileInfo(QString::fromLocal8Bit(currentFilenames.top())).dir(),
                         QString::fromLocal8Bit(metaDataFile));
            for (const IncludePath &p : std::as_const(includes)) {
                if (fi.exists())
                    break;
                if (p.isFrameworkPath)
                    continue;

                fi.setFile(QString::fromLocal8Bit(p.path.constData()), QString::fromLocal8Bit(metaDataFile.constData()));
                // try again, maybe there's a file later in the include paths with the same name
                if (fi.isDir()) {
                    fi = QFileInfo();
                    continue;
                }
            }
            if (!fi.exists()) {
                const QByteArray msg = "Plugin Metadata file " + lexem()
                        + " does not exist. Declaration will be ignored";
                error(msg.constData());
                return;
            }
            QFile file(fi.canonicalFilePath());
            if (!file.open(QFile::ReadOnly)) {
                QByteArray msg = "Plugin Metadata file " + lexem() + " could not be opened: "
                    + file.errorString().toUtf8();
                error(msg.constData());
                return;
            }
            parsedPluginMetadataFiles.append(fi.canonicalFilePath());
            metaData = file.readAll();
        }
    }

    if (!metaData.isEmpty()) {
        def->pluginData.metaData = QJsonDocument::fromJson(metaData);
        if (!def->pluginData.metaData.isObject()) {
            const QByteArray msg = "Plugin Metadata file " + lexem()
                    + " does not contain a valid JSON object. Declaration will be ignored";
            warning(msg.constData());
            def->pluginData.iid = QByteArray();
            def->pluginData.uri = QByteArray();
            return;
        }
    }

    mustIncludeQPluginH = true;
    next(RPAREN);
}